

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineExpression.hpp
# Opt level: O0

string * __thiscall
Kandinsky::CosineExpression::toString_abi_cxx11_(CosineExpression *this,bool evaluate)

{
  element_type *peVar1;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  __lhs = in_RDI;
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12e727);
  (*peVar1->_vptr_BaseExpression[5])(local_58,peVar1,(ulong)(local_11 & 1));
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return __lhs;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return "cos(" + m_arg->toString(evaluate) + ")";
        }